

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplication::setStyleSheet(QApplication *this,QString *styleSheet)

{
  QStyleSheetStyle *this_00;
  QStyleSheetStyle *this_01;
  
  QString::operator=(&QApplicationPrivate::styleSheet,(QString *)styleSheet);
  this_00 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>
                      (&QApplicationPrivate::app_style->super_QObject);
  if ((styleSheet->d).size == 0) {
    if (this_00 == (QStyleSheetStyle *)0x0) {
      return;
    }
    this_01 = (QStyleSheetStyle *)this_00->base;
  }
  else {
    if (this_00 != (QStyleSheetStyle *)0x0) {
      QStyleSheetStyle::repolish((QStyleSheetStyle *)this_00,QCoreApplication::self);
      return;
    }
    this_01 = (QStyleSheetStyle *)operator_new(0x60);
    QStyleSheetStyle::QStyleSheetStyle(this_01,QApplicationPrivate::app_style);
    QObject::setParent(&QApplicationPrivate::app_style->super_QObject);
  }
  setStyle((QStyle *)this_01);
  return;
}

Assistant:

void QApplication::setStyleSheet(const QString& styleSheet)
{
    QApplicationPrivate::styleSheet = styleSheet;
    QStyleSheetStyle *styleSheetStyle = qt_styleSheet(QApplicationPrivate::app_style);
    if (styleSheet.isEmpty()) { // application style sheet removed
        if (!styleSheetStyle)
            return; // there was no stylesheet before
        setStyle(styleSheetStyle->base);
    } else if (styleSheetStyle) { // style sheet update, just repolish
        styleSheetStyle->repolish(qApp);
    } else { // stylesheet set the first time
        QStyleSheetStyle *newStyleSheetStyle = new QStyleSheetStyle(QApplicationPrivate::app_style);
        QApplicationPrivate::app_style->setParent(newStyleSheetStyle);
        setStyle(newStyleSheetStyle);
    }
}